

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O2

ZyanStatus
ZydisFormatterIntelPrintRegister
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisRegister reg)

{
  ZyanStatus ZVar1;
  ZydisShortString *source;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x138,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x139,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x13a,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  source = ZydisRegisterGetStringWrapped(reg);
  if (source == (ZydisShortString *)0x0) {
    if (buffer->is_token_list == '\0') {
      ZVar1 = ZydisStringAppendShortCase(&buffer->string,&STR_INVALID_REG,formatter->case_registers)
      ;
    }
    else {
      ZVar1 = ZydisFormatterBufferAppendPredefined
                        (buffer,(ZydisPredefinedToken *)&TOK_DATA_INVALID_REG);
    }
    if (-1 < (int)ZVar1) {
      ZVar1 = 0x100000;
    }
    return ZVar1;
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar1 = ZydisFormatterBufferAppend(buffer,'\a'), (int)ZVar1 < 0)) {
    return ZVar1;
  }
  ZVar1 = ZydisStringAppendShortCase(&buffer->string,source,formatter->case_registers);
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisRegister reg)
{
    ZYAN_UNUSED(context);

    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    const ZydisShortString* str = ZydisRegisterGetStringWrapped(reg);
    if (!str)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_REG, formatter->case_registers);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_REGISTER);
    return ZydisStringAppendShortCase(&buffer->string, str, formatter->case_registers);
}